

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextOption::Tab>::moveAppend
          (QGenericArrayOps<QTextOption::Tab> *this,Tab *b,Tab *e)

{
  long lVar1;
  Tab *pTVar2;
  qreal *in_RDX;
  qreal *in_RSI;
  long in_RDI;
  Tab *data;
  qreal *local_10;
  
  if (in_RSI != in_RDX) {
    pTVar2 = QArrayDataPointer<QTextOption::Tab>::begin
                       ((QArrayDataPointer<QTextOption::Tab> *)0x83f977);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      lVar1 = *(long *)(in_RDI + 0x10);
      pTVar2[lVar1].position = *local_10;
      *(qreal *)&pTVar2[lVar1].type = local_10[1];
      local_10 = local_10 + 2;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }